

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

boolean could_advance(int skill)

{
  char cVar1;
  uint uVar2;
  
  cVar1 = u.weapon_skills[skill].skill;
  if ((cVar1 != '\0') && (cVar1 < u.weapon_skills[skill].max_skill)) {
    uVar2 = (int)cVar1 * (int)cVar1 * 0x14;
    if (6 < skill - 0x1eU) {
      uVar2 = 100 << (cVar1 - 1U & 0x1f);
    }
    return u.skills_advanced < 0x3c && uVar2 <= u.weapon_skills[skill].advance;
  }
  return '\0';
}

Assistant:

static boolean could_advance(int skill)
{
    return !P_RESTRICTED(skill)
	    && P_SKILL(skill) < P_MAX_SKILL(skill) && (
	    (P_ADVANCE(skill) >=
		(unsigned) practice_needed_to_advance(skill, P_SKILL(skill))
	    && u.skills_advanced < P_SKILL_LIMIT));
}